

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

void __thiscall DCanvas::PUTTRANSDOT(DCanvas *this,int xx,int yy,int basecolor,int level)

{
  uint uVar1;
  
  if (PUTTRANSDOT::oldyy + 1 == yy) {
    PUTTRANSDOT::oldyyshifted = PUTTRANSDOT::oldyyshifted + this->Pitch;
    PUTTRANSDOT::oldyy = yy;
  }
  else if (PUTTRANSDOT::oldyy + -1 == yy) {
    PUTTRANSDOT::oldyyshifted = PUTTRANSDOT::oldyyshifted - this->Pitch;
    PUTTRANSDOT::oldyy = yy;
  }
  else if (PUTTRANSDOT::oldyy != yy) {
    PUTTRANSDOT::oldyyshifted = yy * this->Pitch;
    PUTTRANSDOT::oldyy = yy;
  }
  uVar1 = *(int *)((long)level * 0x400 + 0x1bf1e50 +
                  (ulong)this->Buffer[(long)xx + (long)PUTTRANSDOT::oldyyshifted] * 4) +
          Col2RGB8[0x3f - level][basecolor] | 0x1f07c1f;
  this->Buffer[(long)xx + (long)PUTTRANSDOT::oldyyshifted] = RGB32k.All[uVar1 >> 0xf & uVar1];
  return;
}

Assistant:

void DCanvas::PUTTRANSDOT (int xx, int yy, int basecolor, int level)
{
	static int oldyy;
	static int oldyyshifted;

#if 0
	if(xx < 32)
		cc += 7-(xx>>2);
	else if(xx > (finit_width - 32))
		cc += 7-((finit_width-xx) >> 2);
//	if(cc==oldcc) //make sure that we don't double fade the corners.
//	{
		if(yy < 32)
			cc += 7-(yy>>2);
		else if(yy > (finit_height - 32))
			cc += 7-((finit_height-yy) >> 2);
//	}
	if(cc > cm && cm != NULL)
	{
		cc = cm;
	}
	else if(cc > oldcc+6) // don't let the color escape from the fade table...
	{
		cc=oldcc+6;
	}
#endif
	if (yy == oldyy+1)
	{
		oldyy++;
		oldyyshifted += GetPitch();
	}
	else if (yy == oldyy-1)
	{
		oldyy--;
		oldyyshifted -= GetPitch();
	}
	else if (yy != oldyy)
	{
		oldyy = yy;
		oldyyshifted = yy * GetPitch();
	}

	BYTE *spot = GetBuffer() + oldyyshifted + xx;
	DWORD *bg2rgb = Col2RGB8[1+level];
	DWORD *fg2rgb = Col2RGB8[63-level];
	DWORD fg = fg2rgb[basecolor];
	DWORD bg = bg2rgb[*spot];
	bg = (fg+bg) | 0x1f07c1f;
	*spot = RGB32k.All[bg&(bg>>15)];
}